

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

void ft_stroke_border_close(PVG_FT_StrokeBorder border,PVG_FT_Bool reverse)

{
  PVG_FT_Byte PVar1;
  uint uVar2;
  uint uVar3;
  PVG_FT_Vector *pPVar4;
  PVG_FT_Vector *pPVar5;
  PVG_FT_Pos PVar6;
  PVG_FT_Pos PVar7;
  uint uVar8;
  PVG_FT_Byte *pPStack_50;
  PVG_FT_Byte tmp_1;
  PVG_FT_Byte *tag2;
  PVG_FT_Byte *tag1;
  PVG_FT_Vector tmp;
  PVG_FT_Vector *vec2;
  PVG_FT_Vector *vec1;
  PVG_FT_UInt count;
  PVG_FT_UInt start;
  PVG_FT_Bool reverse_local;
  PVG_FT_StrokeBorder border_local;
  
  uVar2 = border->start;
  uVar3 = border->num_points;
  if (border->start < 0) {
    __assert_fail("border->start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                  ,0x111,"void ft_stroke_border_close(PVG_FT_StrokeBorder, PVG_FT_Bool)");
  }
  if (uVar2 + 1 < uVar3) {
    uVar8 = uVar3 - 1;
    border->num_points = uVar8;
    pPVar4 = border->points;
    pPVar5 = border->points;
    pPVar4[uVar2].x = pPVar5[uVar8].x;
    pPVar4[uVar2].y = pPVar5[uVar8].y;
    border->tags[uVar2] = border->tags[uVar8];
    if (reverse != '\0') {
      pPVar4 = border->points + uVar8;
      pPVar5 = border->points + uVar2;
      while( true ) {
        vec2 = pPVar5 + 1;
        tmp.y = (PVG_FT_Pos)(pPVar4 + -1);
        if ((ulong)tmp.y <= vec2) break;
        PVar6 = vec2->x;
        PVar7 = pPVar5[1].y;
        vec2->x = *(PVG_FT_Pos *)tmp.y;
        pPVar5[1].y = pPVar4[-1].y;
        *(PVG_FT_Pos *)tmp.y = PVar6;
        pPVar4[-1].y = PVar7;
        pPVar4 = (PVG_FT_Vector *)tmp.y;
        pPVar5 = vec2;
      }
      tag2 = border->tags + uVar2;
      pPStack_50 = border->tags + uVar8;
      while( true ) {
        tag2 = tag2 + 1;
        pPStack_50 = pPStack_50 + -1;
        if (pPStack_50 <= tag2) break;
        PVar1 = *tag2;
        *tag2 = *pPStack_50;
        *pPStack_50 = PVar1;
      }
    }
    border->tags[uVar2] = border->tags[uVar2] | 4;
    border->tags[uVar3 - 2] = border->tags[uVar3 - 2] | 8;
  }
  else {
    border->num_points = uVar2;
  }
  border->start = -1;
  border->movable = '\0';
  return;
}

Assistant:

static void ft_stroke_border_close(PVG_FT_StrokeBorder border,
                                   PVG_FT_Bool         reverse)
{
    PVG_FT_UInt start = border->start;
    PVG_FT_UInt count = border->num_points;

    assert(border->start >= 0);

    /* don't record empty paths! */
    if (count <= start + 1U)
        border->num_points = start;
    else {
        /* copy the last point to the start of this sub-path, since */
        /* it contains the `adjusted' starting coordinates          */
        border->num_points = --count;
        border->points[start] = border->points[count];
        border->tags[start]   = border->tags[count];

        if (reverse) {
            /* reverse the points */
            {
                PVG_FT_Vector* vec1 = border->points + start + 1;
                PVG_FT_Vector* vec2 = border->points + count - 1;

                for (; vec1 < vec2; vec1++, vec2--) {
                    PVG_FT_Vector tmp;

                    tmp = *vec1;
                    *vec1 = *vec2;
                    *vec2 = tmp;
                }
            }

            /* then the tags */
            {
                PVG_FT_Byte* tag1 = border->tags + start + 1;
                PVG_FT_Byte* tag2 = border->tags + count - 1;

                for (; tag1 < tag2; tag1++, tag2--) {
                    PVG_FT_Byte tmp;

                    tmp = *tag1;
                    *tag1 = *tag2;
                    *tag2 = tmp;
                }
            }
        }

        border->tags[start] |= PVG_FT_STROKE_TAG_BEGIN;
        border->tags[count - 1] |= PVG_FT_STROKE_TAG_END;
    }

    border->start = -1;
    border->movable = FALSE;
}